

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

void __thiscall JFSON::Json::Json(Json *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  statics();
  (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       statics::s.null.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = statics::s.null.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       statics::s.null.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

Json::Json() noexcept                  : m_ptr(statics().null) {}